

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

void __thiscall despot::log_ostream::log_buf::~log_buf(log_buf *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__log_buf_00191310;
  pcVar2 = (this->marker_)._M_dataplus._M_p;
  paVar1 = &(this->marker_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  *(code **)this = std::ios_base::Init::~Init;
  if (*(undefined1 **)&this->field_0x48 != &this->field_0x58) {
    operator_delete(*(undefined1 **)&this->field_0x48,*(long *)&this->field_0x58 + 1);
  }
  *(code **)this = __assert_fail;
  std::locale::~locale((locale *)&this->field_0x38);
  return;
}

Assistant:

log_ostream::log_buf::~log_buf() {
	// pubsync();
}